

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_getmetatable(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  undefined8 *in_RSI;
  long in_RDI;
  RecordIndex ix;
  TRef tr;
  undefined8 local_90 [6];
  int local_60;
  undefined4 local_54;
  undefined4 local_50;
  int local_44;
  long local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 local_20;
  char *local_18;
  undefined8 *local_10;
  undefined8 local_8;
  
  local_60 = **(int **)(in_RDI + 0x88);
  if (local_60 != 0) {
    local_20 = *(undefined8 *)(in_RDI + 0x68);
    local_28 = local_90;
    local_30 = (undefined8 *)*in_RSI;
    local_90[0] = *local_30;
    local_18 = "copy of dead GC object";
    local_44 = local_60;
    local_38 = in_RDI;
    local_10 = local_28;
    local_8 = local_20;
    iVar1 = lj_record_mm_lookup((jit_State *)ix.mtv,(RecordIndex *)ix.mobjv,ix.valv.field_2.it);
    if (iVar1 == 0) {
      **(undefined4 **)(local_38 + 0x88) = local_54;
    }
    else {
      **(undefined4 **)(local_38 + 0x88) = local_50;
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_getmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    if (lj_record_mm_lookup(J, &ix, MM_metatable))
      J->base[0] = ix.mobj;
    else
      J->base[0] = ix.mt;
  }  /* else: Interpreter will throw. */
}